

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void google::protobuf::internal::SwapFieldHelper::SwapStringField<false>
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  CppStringType CVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  Cord __tmp;
  anon_union_16_2_39e9c77e_for_Rep_0 local_38;
  
  CVar5 = FieldDescriptor::cpp_string_type(field);
  if ((CVar5 != kView) && (CVar5 != kString)) {
    if (CVar5 == kCord) {
      Reflection::VerifyFieldType<absl::lts_20250127::Cord>(r,field);
      puVar6 = (undefined8 *)Reflection::MutableRawImpl(r,lhs,field);
      Reflection::VerifyFieldType<absl::lts_20250127::Cord>(r,field);
      puVar7 = (undefined8 *)Reflection::MutableRawImpl(r,rhs,field);
      uVar1 = *puVar6;
      uVar2 = puVar6[1];
      *puVar6 = 0;
      puVar6[1] = 0;
      uVar3 = puVar7[1];
      *puVar6 = *puVar7;
      puVar6[1] = uVar3;
      *puVar7 = uVar1;
      puVar7[1] = uVar2;
      local_38.as_tree.cordz_info = 0;
      local_38.as_tree.rep = (CordRep *)0x0;
      absl::lts_20250127::Cord::~Cord((Cord *)&local_38.as_tree);
    }
    return;
  }
  bVar4 = ReflectionSchema::IsFieldInlined(&r->schema_,field);
  if (bVar4) {
    SwapInlinedStrings<false>(r,lhs,rhs,field);
    return;
  }
  SwapNonInlinedStrings<false>(r,lhs,rhs,field);
  return;
}

Assistant:

void SwapFieldHelper::SwapStringField(const Reflection* r, Message* lhs,
                                      Message* rhs,
                                      const FieldDescriptor* field) {
  switch (field->cpp_string_type()) {
    case FieldDescriptor::CppStringType::kCord:
      // Always shallow swap for Cord.
      std::swap(*r->MutableRaw<absl::Cord>(lhs, field),
                *r->MutableRaw<absl::Cord>(rhs, field));
      break;
    case FieldDescriptor::CppStringType::kView:
    case FieldDescriptor::CppStringType::kString: {
      if (r->IsInlined(field)) {
        SwapFieldHelper::SwapInlinedStrings<unsafe_shallow_swap>(r, lhs, rhs,
                                                                 field);
      } else if (r->IsMicroString(field)) {
        auto* lhs_string = r->MutableRaw<MicroString>(lhs, field);
        auto* rhs_string = r->MutableRaw<MicroString>(rhs, field);
        auto* lhs_arena = lhs->GetArena();
        auto* rhs_arena = rhs->GetArena();
        if (unsafe_shallow_swap || lhs_arena == rhs_arena) {
          lhs_string->InternalSwap(rhs_string);
        } else {
          MicroString tmp;
          tmp.Set(*lhs_string, rhs_arena);
          lhs_string->Set(*rhs_string, lhs_arena);
          if (rhs_arena == nullptr) rhs_string->Destroy();
          *rhs_string = tmp;
        }
      } else {
        SwapFieldHelper::SwapNonInlinedStrings<unsafe_shallow_swap>(r, lhs, rhs,
                                                                    field);
      }
      break;
    }
  }
}